

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O0

int metacall_serial_impl_deserialize_float(value *v,char *src,size_t length)

{
  bool bVar1;
  ushort **ppuVar2;
  long lVar3;
  ulong in_RDX;
  char *in_RSI;
  long *in_RDI;
  double dVar4;
  size_t is_digit;
  size_t iterator;
  ulong local_28;
  
  bVar1 = false;
  local_28 = 0;
  while( true ) {
    if (in_RDX <= local_28) {
      dVar4 = atof(in_RSI);
      lVar3 = value_create_float((float)dVar4);
      *in_RDI = lVar3;
      return (uint)(*in_RDI == 0);
    }
    ppuVar2 = __ctype_b_loc();
    if ((((((*ppuVar2)[(int)in_RSI[local_28]] & 0x800) == 0) && (in_RSI[local_28] != '.')) &&
        (in_RSI[local_28] != '-')) &&
       (((in_RSI[local_28] != '+' && (in_RSI[local_28] != 'E')) && (in_RSI[local_28] != 'f'))))
    break;
    if (in_RSI[local_28] == '.') {
      if (bVar1) {
        return 1;
      }
      bVar1 = true;
    }
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

int metacall_serial_impl_deserialize_float(value *v, const char *src, size_t length)
{
	size_t iterator, is_digit;

	/* TODO: Improve parser */
	for (is_digit = 0, iterator = 0; iterator < length; ++iterator)
	{
		if (isdigit((int)src[iterator]) == 0 &&
			src[iterator] != '.' &&
			src[iterator] != '-' &&
			src[iterator] != '+' &&
			src[iterator] != 'E' &&
			src[iterator] != 'f')
		{
			return 1;
		}

		if (src[iterator] == '.')
		{
			if (is_digit == 1)
			{
				return 1;
			}

			is_digit = 1;
		}
	}

	/* TODO: Warning possible information lost in casting */
	*v = value_create_float((float)atof(src));

	return (*v == NULL);
}